

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O1

int64_t __thiscall
cmDebugger::cmDebuggerBreakpointManager::FindFunctionStartLine
          (cmDebuggerBreakpointManager *this,string *sourcePath,int64_t line)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  int64_t iVar3;
  pointer pcVar4;
  long lVar5;
  pointer pcVar6;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>_>
  *this_00;
  
  this_00 = &this->ListFileFunctionLines;
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,sourcePath);
  pcVar4 = (pmVar2->
           super__Vector_base<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,sourcePath);
  pcVar1 = (pmVar2->
           super__Vector_base<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pcVar1 - (long)pcVar4 >> 6;
  pcVar6 = pcVar4;
  if (0 < lVar5) {
    pcVar6 = (pointer)((long)&pcVar4->StartLine +
                      ((long)pcVar1 - (long)pcVar4 & 0xffffffffffffffc0U));
    lVar5 = lVar5 + 1;
    pcVar4 = pcVar4 + 2;
    do {
      if ((pcVar4[-2].StartLine <= line) && (line <= pcVar4[-2].EndLine)) {
        pcVar4 = pcVar4 + -2;
        goto LAB_0043239e;
      }
      if ((pcVar4[-1].StartLine <= line) && (line <= pcVar4[-1].EndLine)) {
        pcVar4 = pcVar4 + -1;
        goto LAB_0043239e;
      }
      if ((pcVar4->StartLine <= line) && (line <= pcVar4->EndLine)) goto LAB_0043239e;
      if ((pcVar4[1].StartLine <= line) && (line <= pcVar4[1].EndLine)) {
        pcVar4 = pcVar4 + 1;
        goto LAB_0043239e;
      }
      lVar5 = lVar5 + -1;
      pcVar4 = pcVar4 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar1 - (long)pcVar6 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pcVar4 = pcVar1;
      if ((lVar5 != 3) ||
         ((pcVar6->StartLine <= line && (pcVar4 = pcVar6, line <= pcVar6->EndLine))))
      goto LAB_0043239e;
      pcVar6 = pcVar6 + 1;
    }
    if ((pcVar6->StartLine <= line) && (pcVar4 = pcVar6, line <= pcVar6->EndLine))
    goto LAB_0043239e;
    pcVar6 = pcVar6 + 1;
  }
  pcVar4 = pcVar1;
  if (line <= pcVar6->EndLine) {
    pcVar4 = pcVar6;
  }
  if (line < pcVar6->StartLine) {
    pcVar4 = pcVar1;
  }
LAB_0043239e:
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,sourcePath);
  if (pcVar4 == (pmVar2->
                super__Vector_base<cmDebugger::cmDebuggerFunctionLocation,_std::allocator<cmDebugger::cmDebuggerFunctionLocation>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 0;
  }
  else {
    iVar3 = pcVar4->StartLine;
  }
  return iVar3;
}

Assistant:

int64_t cmDebuggerBreakpointManager::FindFunctionStartLine(
  std::string const& sourcePath, int64_t line)
{
  auto location =
    find_if(ListFileFunctionLines[sourcePath].begin(),
            ListFileFunctionLines[sourcePath].end(),
            [=](cmDebuggerFunctionLocation const& loc) {
              return loc.StartLine <= line && loc.EndLine >= line;
            });

  if (location != ListFileFunctionLines[sourcePath].end()) {
    return location->StartLine;
  }

  return 0;
}